

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O2

void ResizeNodeDistPages(void)

{
  int iVar1;
  NodeDist_t **ppNVar2;
  ulong uVar3;
  NodeDist_t **__ptr;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = nodeDistPage;
  lVar7 = (long)nodeDistPage;
  uVar4 = nodeDistPage + 1;
  nodeDistPage = uVar4;
  if (uVar4 == maxNodeDistPages) {
    ppNVar2 = (NodeDist_t **)malloc(lVar7 * 8 + 0x408);
    __ptr = nodeDistPages;
    if (ppNVar2 == (NodeDist_t **)0x0) {
      for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
        if (__ptr[lVar6] != (NodeDist_t *)0x0) {
          free(__ptr[lVar6]);
          __ptr[lVar6] = (NodeDist_t *)0x0;
        }
      }
      if (__ptr == (NodeDist_t **)0x0) {
        memOut = 1;
        return;
      }
      goto LAB_0062abae;
    }
    maxNodeDistPages = iVar1 + 0x81;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      ppNVar2[uVar3] = __ptr[uVar3];
    }
    free(__ptr);
    nodeDistPages = ppNVar2;
  }
  __ptr = nodeDistPages;
  currentNodeDistPage = (NodeDist_t *)malloc(0x10000);
  __ptr[lVar7 + 1] = currentNodeDistPage;
  if (currentNodeDistPage != (NodeDist_t *)0x0) {
    nodeDistPageIndex = 0;
    return;
  }
  currentNodeDistPage = (NodeDist_t *)0x0;
  for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
    if (__ptr[lVar6] != (NodeDist_t *)0x0) {
      free(__ptr[lVar6]);
      __ptr[lVar6] = (NodeDist_t *)0x0;
    }
  }
LAB_0062abae:
  free(__ptr);
  nodeDistPages = (NodeDist_t **)0x0;
  memOut = 1;
  return;
}

Assistant:

static void
ResizeNodeDistPages(void)
{
    int i;
    NodeDist_t **newNodeDistPages;

    /* move to next page */
    nodeDistPage++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (nodeDistPage == maxNodeDistPages) {
        newNodeDistPages = ABC_ALLOC(NodeDist_t *,maxNodeDistPages + INITIAL_PAGES);
        if (newNodeDistPages == NULL) {
            for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
            ABC_FREE(nodeDistPages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxNodeDistPages; i++) {
                newNodeDistPages[i] = nodeDistPages[i];
            }
            /* Increase total page count */
            maxNodeDistPages += INITIAL_PAGES;
            ABC_FREE(nodeDistPages);
            nodeDistPages = newNodeDistPages;
        }
    }
    /* Allocate a new page */
    currentNodeDistPage = nodeDistPages[nodeDistPage] = ABC_ALLOC(NodeDist_t,
                                                              nodeDistPageSize);
    if (currentNodeDistPage == NULL) {
        for (i = 0; i < nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
        ABC_FREE(nodeDistPages);
        memOut = 1;
        return;
    }
    /* reset page index */
    nodeDistPageIndex = 0;
    return;

}